

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int renameTableExprCb(Walker *pWalker,Expr *pExpr)

{
  char *in_RSI;
  undefined8 *in_RDI;
  RenameCtx *p;
  
  if (((*in_RSI == -0x58) && ((*(uint *)(in_RSI + 4) & 0x3000000) == 0)) &&
     (((RenameCtx *)in_RDI[5])->pTab == *(Table **)(in_RSI + 0x40))) {
    renameTokenFind((Parse *)*in_RDI,(RenameCtx *)in_RDI[5],in_RSI + 0x40);
  }
  return 0;
}

Assistant:

static int renameTableExprCb(Walker *pWalker, Expr *pExpr){
  RenameCtx *p = pWalker->u.pRename;
  if( pExpr->op==TK_COLUMN
   && ALWAYS(ExprUseYTab(pExpr))
   && p->pTab==pExpr->y.pTab
  ){
    renameTokenFind(pWalker->pParse, p, (void*)&pExpr->y.pTab);
  }
  return WRC_Continue;
}